

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

String __thiscall testing::internal::DeathTestThreadWarning(internal *this,size_t thread_count)

{
  Message *pMVar1;
  size_t extraout_RDX;
  String SVar2;
  Message *in_stack_ffffffffffffffa0;
  Message local_20;
  Message msg;
  size_t thread_count_local;
  
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )thread_count;
  Message::Message(in_stack_ffffffffffffffa0);
  pMVar1 = Message::operator<<(&local_20,
                               (char (*) [53])"Death tests use fork(), which is unsafe particularly"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [40])" in a threaded context. For this test, ");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [12])"Google Test");
  Message::operator<<(pMVar1,(char (*) [2])0x14dc08);
  if (msg.ss_.ptr_ == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    Message::operator<<(&local_20,(char (*) [39])"couldn\'t detect the number of threads.");
  }
  else {
    pMVar1 = Message::operator<<(&local_20,(char (*) [10])"detected ");
    pMVar1 = Message::operator<<(pMVar1,(unsigned_long *)&msg);
    Message::operator<<(pMVar1,(char (*) [10])0x14e62c);
  }
  Message::GetString((Message *)this);
  Message::~Message((Message *)0x1294b3);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

static String DeathTestThreadWarning(size_t thread_count) {
  Message msg;
  msg << "Death tests use fork(), which is unsafe particularly"
      << " in a threaded context. For this test, " << GTEST_NAME_ << " ";
  if (thread_count == 0)
    msg << "couldn't detect the number of threads.";
  else
    msg << "detected " << thread_count << " threads.";
  return msg.GetString();
}